

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O0

void tcase_set_timeout(TCase *tc,double timeout)

{
  char *pcVar1;
  double dVar2;
  double tmp;
  char *endptr;
  char *env;
  double timeout_local;
  TCase *tc_local;
  
  if (0.0 <= timeout) {
    env = (char *)timeout;
    timeout_local = (double)tc;
    endptr = getenv("CK_TIMEOUT_MULTIPLIER");
    if (endptr != (char *)0x0) {
      tmp = 0.0;
      dVar2 = strtod(endptr,(char **)&tmp);
      if (((0.0 <= dVar2) && ((char *)tmp != endptr)) && (*(char *)tmp == '\0')) {
        env = (char *)((double)env * dVar2);
      }
    }
    dVar2 = floor((double)env);
    pcVar1 = env;
    *(long *)((long)timeout_local + 8) = (long)dVar2;
    dVar2 = floor((double)env);
    *(long *)((long)timeout_local + 0x10) = (long)(((double)pcVar1 - dVar2) * 1000000000.0);
  }
  return;
}

Assistant:

void tcase_set_timeout(TCase * tc, double timeout)
{
#if defined(HAVE_FORK)
    if(timeout >= 0)
    {
        char *env = getenv("CK_TIMEOUT_MULTIPLIER");

        if(env != NULL)
        {
            char *endptr = NULL;
            double tmp = strtod(env, &endptr);

            if(tmp >= 0 && endptr != env && (*endptr) == '\0')
            {
                timeout = timeout * tmp;
            }
        }

        tc->timeout.tv_sec = (time_t) floor(timeout);
        tc->timeout.tv_nsec =
            (long)((timeout - floor(timeout)) * (double)NANOS_PER_SECONDS);
    }
#else
    (void)tc;
    (void)timeout;
    /* Ignoring, as Check is not compiled with fork support. */
#endif /* HAVE_FORK */
}